

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O3

void __thiscall OpenMD::CubicSpline::addPoint(CubicSpline *this,RealType xp,RealType yp)

{
  iterator iVar1;
  RealType local_18;
  RealType local_10;
  
  iVar1._M_current =
       (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = yp;
  local_10 = xp;
  if (iVar1._M_current ==
      (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->x_,iVar1,&local_10);
  }
  else {
    *iVar1._M_current = xp;
    (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->y_,iVar1,&local_18);
  }
  else {
    *iVar1._M_current = yp;
    (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void CubicSpline::addPoint(const RealType xp, const RealType yp) {
    x_.push_back(xp);
    y_.push_back(yp);
  }